

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O2

string * trimEnd(string *__return_storage_ptr__,string *input)

{
  __const_iterator local_28;
  pointer local_20;
  pointer local_18;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,input);
  local_20 = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_18 = local_20 + __return_storage_ptr__->_M_string_length;
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,trimEnd(std::__cxx11::string_const&)::_lambda(char)_1_>
            (&local_28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (__return_storage_ptr__,local_28,
             (__const_iterator)
             ((__return_storage_ptr__->_M_dataplus)._M_p + __return_storage_ptr__->_M_string_length)
            );
  return __return_storage_ptr__;
}

Assistant:

inline std::string trimEnd( std::string const & input )
{
  std::string result = input;
  result.erase( std::find_if( result.rbegin(), result.rend(), []( char c ) noexcept { return !std::isspace( c ); } ).base(), result.end() );
  return result;
}